

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O2

void __thiscall
HDWallet_GenerateBip84KeyTest_Test::TestBody(HDWallet_GenerateBip84KeyTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Bip32FormatType format_type;
  AssertionResult gtest_ar_17;
  AssertHelper local_920;
  AssertionResult gtest_ar_18;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs;
  HDWallet wallet;
  KeyData keypath2;
  Address addr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ExtPrivkey vpriv1;
  KeyData keypath1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path2;
  ByteData seed;
  ExtPubkey zpub1;
  ExtPubkey pubkey;
  ExtPubkey pubkey0;
  ExtPubkey pubkeyh;
  ExtPrivkey privkey;
  ExtPrivkey privkey0;
  
  std::__cxx11::string::string
            ((string *)&keypath1,
             "c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04"
             ,(allocator *)&keypath2);
  cfd::core::ByteData::ByteData(&seed,(string *)&keypath1);
  std::__cxx11::string::~string((string *)&keypath1);
  cfd::core::HDWallet::HDWallet(&wallet);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::HDWallet((HDWallet *)&keypath1,&seed);
      cfd::core::ByteData::operator=(&wallet.seed_,(ByteData *)&keypath1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&keypath1);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&keypath2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1c8,
               "Expected: (wallet = HDWallet(seed)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&keypath2,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keypath2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  format_type = kBip84;
  cfd::core::ExtPrivkey::ExtPrivkey(&privkey);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePrivkey((ExtPrivkey *)&keypath1,&wallet,kMainnet,format_type);
      cfd::core::Extkey::operator=(&privkey.super_Extkey,(Extkey *)&keypath1);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath1);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&keypath2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1cd,
               "Expected: (privkey = wallet.GeneratePrivkey( NetType::kMainnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&keypath2,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keypath2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath1,&privkey.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&keypath2,"privkey.ToString().c_str()",
             "\"zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC\""
             ,(char *)keypath1.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC"
            );
  std::__cxx11::string::~string((string *)&keypath1);
  if ((char)keypath2.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&keypath1);
    if (keypath2.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 8));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePrivkey((ExtPrivkey *)&keypath1,&wallet,kTestnet,format_type);
      cfd::core::Extkey::operator=(&privkey.super_Extkey,(Extkey *)&keypath1);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath1);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&keypath2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d0,
               "Expected: (privkey = wallet.GeneratePrivkey(NetType::kTestnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&keypath2,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keypath2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath1,&privkey.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&keypath2,"privkey.ToString().c_str()",
             "\"vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M\""
             ,(char *)keypath1.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M"
            );
  std::__cxx11::string::~string((string *)&keypath1);
  if ((char)keypath2.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&keypath1);
    if (keypath2.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 8));
  keypath1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x2c00000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&keypath1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&path,__l,(allocator_type *)&keypath2);
  cfd::core::ExtPrivkey::ExtPrivkey(&privkey0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePrivkey
                ((ExtPrivkey *)&keypath1,&wallet,kMainnet,&path,format_type);
      cfd::core::Extkey::operator=(&privkey0.super_Extkey,(Extkey *)&keypath1);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath1);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&keypath2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d6,
               "Expected: (privkey0 = wallet.GeneratePrivkey( NetType::kMainnet, path, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&keypath2,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keypath2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath1,&privkey0.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&keypath2,"privkey0.ToString().c_str()",
             "\"zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED\""
             ,(char *)keypath1.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED"
            );
  std::__cxx11::string::~string((string *)&keypath1);
  if ((char)keypath2.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&keypath1);
    if (keypath2.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&keypath2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 8));
  cfd::core::KeyData::KeyData(&keypath1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&addr,"m/0h/44h",(allocator *)&pubkey);
      cfd::core::HDWallet::GeneratePrivkeyData
                (&keypath2,&wallet,kMainnet,(string *)&addr,format_type);
      cfd::core::KeyData::operator=(&keypath1,&keypath2);
      cfd::core::KeyData::~KeyData(&keypath2);
      std::__cxx11::string::~string((string *)&addr);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1db,
               "Expected: (keypath1 = wallet.GeneratePrivkeyData( NetType::kMainnet, \"m/0h/44h\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&keypath2,&keypath1,true,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"keypath1.ToString().c_str()",
             "\"[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pubkey,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pubkey,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pubkey);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&keypath2,&keypath1,false,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"keypath1.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "[b4e3f5ed/0\'/44\']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pubkey,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pubkey,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pubkey);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::ExtPubkey::ExtPubkey(&pubkey);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePubkey((ExtPubkey *)&keypath2,&wallet,kMainnet,format_type);
      cfd::core::Extkey::operator=(&pubkey.super_Extkey,(Extkey *)&keypath2);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath2);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e0,
               "Expected: (pubkey = wallet.GeneratePubkey(NetType::kMainnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath2,&pubkey.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"pubkey.ToString().c_str()",
             "\"zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pubkey0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pubkey0,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pubkey0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePubkey((ExtPubkey *)&keypath2,&wallet,kTestnet,format_type);
      cfd::core::Extkey::operator=(&pubkey.super_Extkey,(Extkey *)&keypath2);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath2);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e3,
               "Expected: (pubkey = wallet.GeneratePubkey(NetType::kTestnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath2,&pubkey.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"pubkey.ToString().c_str()",
             "\"vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pubkey0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pubkey0,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pubkey0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::ExtPubkey::ExtPubkey(&pubkey0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePubkey((ExtPubkey *)&keypath2,&wallet,kMainnet,&path,format_type)
      ;
      cfd::core::Extkey::operator=(&pubkey0.super_Extkey,(Extkey *)&keypath2);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath2);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e7,
               "Expected: (pubkey0 = wallet.GeneratePubkey(NetType::kMainnet, path, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath2,&pubkey0.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"pubkey0.ToString().c_str()",
             "\"zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pubkeyh,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pubkeyh,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pubkeyh);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::ExtPubkey::ExtPubkey(&pubkeyh);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&addr,"m/0H/44H",(allocator *)&vpriv1);
      cfd::core::HDWallet::GeneratePubkey
                ((ExtPubkey *)&keypath2,&wallet,kMainnet,(string *)&addr,format_type);
      cfd::core::Extkey::operator=(&pubkeyh.super_Extkey,(Extkey *)&keypath2);
      cfd::core::Extkey::~Extkey((Extkey *)&keypath2);
      std::__cxx11::string::~string((string *)&addr);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1eb,
               "Expected: (pubkeyh = wallet.GeneratePubkey(NetType::kMainnet, \"m/0H/44H\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::Extkey::ToString_abi_cxx11_((string *)&keypath2,&pubkeyh.super_Extkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"pubkeyh.ToString().c_str()",
             "\"zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vpriv1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vpriv1,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vpriv1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&addr,"m/0H/44H",(allocator *)&vpriv1);
      cfd::core::HDWallet::GeneratePubkeyData
                (&keypath2,&wallet,kMainnet,(string *)&addr,format_type);
      cfd::core::KeyData::operator=(&keypath1,&keypath2);
      cfd::core::KeyData::~KeyData(&keypath2);
      std::__cxx11::string::~string((string *)&addr);
    }
  }
  else {
    testing::Message::Message((Message *)&keypath2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ee,
               "Expected: (keypath1 = wallet.GeneratePubkeyData(NetType::kMainnet, \"m/0H/44H\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&keypath2,&keypath1,true,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"keypath1.ToString().c_str()",
             "\"[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vpriv1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vpriv1,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vpriv1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&keypath2,&keypath1,false,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&addr,"keypath1.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,(char *)keypath2.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&keypath2);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&keypath2);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vpriv1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vpriv1,(Message *)&keypath2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vpriv1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&keypath2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  keypath2.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x8000002c80000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&keypath2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&path2,__l_00,(allocator_type *)&addr);
  cfd::core::KeyData::KeyData(&keypath2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::GeneratePubkeyData((KeyData *)&addr,&wallet,kMainnet,&path2,format_type);
      cfd::core::KeyData::operator=(&keypath2,(KeyData *)&addr);
      cfd::core::KeyData::~KeyData((KeyData *)&addr);
    }
  }
  else {
    testing::Message::Message((Message *)&addr);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vpriv1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,500,
               "Expected: (keypath2 = wallet.GeneratePubkeyData(NetType::kMainnet, path2, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&vpriv1,(Message *)&addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vpriv1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr);
  }
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&addr,&keypath2,false,kApostrophe,false);
  testing::internal::CmpHelperSTREQ
            ((internal *)&vpriv1,"keypath2.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,(char *)CONCAT71(addr._1_7_,(undefined1)addr.type_),
             "[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&addr);
  if ((char)vpriv1.super_Extkey.version_ == '\0') {
    testing::Message::Message((Message *)&addr);
    if (vpriv1.super_Extkey.fingerprint_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)vpriv1.super_Extkey.fingerprint_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&zpub1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1f5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&zpub1,(Message *)&addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zpub1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&vpriv1.super_Extkey.fingerprint_);
  std::__cxx11::string::string
            ((string *)&addr,
             "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M"
             ,(allocator *)&zpub1);
  cfd::core::ExtPrivkey::ExtPrivkey(&vpriv1,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  zpub1.super_Extkey.version_ = 1;
  gtest_ar_17._0_4_ = cfd::core::Extkey::GetNetworkType(&vpriv1.super_Extkey);
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&addr,"NetType::kTestnet","vpriv1.GetNetworkType()",(NetType *)&zpub1,
             (NetType *)&gtest_ar_17);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&zpub1);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&zpub1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zpub1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  zpub1.super_Extkey.version_ = cfd::core::Extkey::GetFormatType(&vpriv1.super_Extkey);
  testing::internal::CmpHelperEQ<cfd::core::Bip32FormatType,cfd::core::Bip32FormatType>
            ((internal *)&addr,"format_type","vpriv1.GetFormatType()",&format_type,
             (Bip32FormatType *)&zpub1);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&zpub1);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17,(Message *)&zpub1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zpub1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  std::__cxx11::string::string
            ((string *)&addr,
             "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
             ,(allocator *)&gtest_ar_17);
  cfd::core::ExtPubkey::ExtPubkey(&zpub1,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  gtest_ar_17.success_ = false;
  gtest_ar_17._1_3_ = 0;
  addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = cfd::core::Extkey::GetNetworkType(&zpub1.super_Extkey);
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&addr,"NetType::kMainnet","zpub1.GetNetworkType()",(NetType *)&gtest_ar_17,
             (NetType *)&addrs);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addrs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addrs,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addrs);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_17);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  gtest_ar_17._0_4_ = cfd::core::Extkey::GetFormatType(&zpub1.super_Extkey);
  testing::internal::CmpHelperEQ<cfd::core::Bip32FormatType,cfd::core::Bip32FormatType>
            ((internal *)&addr,"format_type","zpub1.GetFormatType()",&format_type,
             (Bip32FormatType *)&gtest_ar_17);
  if ((undefined1)addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addrs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addrs,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addrs);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_17);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr.witness_ver_);
  cfd::core::Extkey::GetPubkeyAddress
            (&addr,&vpriv1.super_Extkey,kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_17,&addr);
  testing::internal::CmpHelperEQ<char[43],std::__cxx11::string>
            ((internal *)&addrs,"\"tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l\"","addr.GetAddress()"
             ,(char (*) [43])"tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_17);
  std::__cxx11::string::~string((string *)&gtest_ar_17);
  if ((char)addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)addrs.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x204,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18,(Message *)&gtest_ar_17)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_17);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Extkey::GetPubkeyAddresses
            (&addrs,&zpub1.super_Extkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  local_920.data_._0_4_ = 1;
  gtest_ar_18._0_8_ =
       ((long)addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       CONCAT44(addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_start._4_4_,
                (NetType)addrs.
                         super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                         ._M_impl.super__Vector_impl_data._M_start)) / 0x180;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_17,"1","addrs.size()",(int *)&local_920,
             (unsigned_long *)&gtest_ar_18);
  if (gtest_ar_17.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_18);
    if (gtest_ar_17.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_17.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x206,pcVar2);
    testing::internal::AssertHelper::operator=(&local_920,(Message *)&gtest_ar_18);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_17.message_);
  cfd::core::Address::GetAddress_abi_cxx11_
            ((string *)&gtest_ar_17,
             (Address *)
             CONCAT44(addrs.
                      super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (NetType)addrs.
                               super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
                               ._M_impl.super__Vector_impl_data._M_start));
  testing::internal::CmpHelperEQ<char[43],std::__cxx11::string>
            ((internal *)&gtest_ar_18,"\"bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9\"",
             "addrs[0].GetAddress()",(char (*) [43])"bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_17);
  std::__cxx11::string::~string((string *)&gtest_ar_17);
  if (gtest_ar_18.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_17);
    if (gtest_ar_18.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_18.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x208,pcVar2);
    testing::internal::AssertHelper::operator=(&local_920,(Message *)&gtest_ar_17);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_17);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_18.message_);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addrs);
  cfd::core::Address::~Address(&addr);
  cfd::core::Extkey::~Extkey(&zpub1.super_Extkey);
  cfd::core::Extkey::~Extkey(&vpriv1.super_Extkey);
  cfd::core::KeyData::~KeyData(&keypath2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::Extkey::~Extkey(&pubkeyh.super_Extkey);
  cfd::core::Extkey::~Extkey(&pubkey0.super_Extkey);
  cfd::core::Extkey::~Extkey(&pubkey.super_Extkey);
  cfd::core::KeyData::~KeyData(&keypath1);
  cfd::core::Extkey::~Extkey(&privkey0.super_Extkey);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::Extkey::~Extkey(&privkey.super_Extkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&seed);
  return;
}

Assistant:

TEST(HDWallet, GenerateBip84KeyTest) {
  ByteData seed("c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04");

  HDWallet wallet;
  EXPECT_NO_THROW((wallet = HDWallet(seed)));
  auto format_type = Bip32FormatType::kBip84;

  ExtPrivkey privkey;
  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(
    NetType::kMainnet, format_type)));
  EXPECT_STREQ(privkey.ToString().c_str(), "zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC");

  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kTestnet, format_type)));
  EXPECT_STREQ(privkey.ToString().c_str(), "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M");

  std::vector<uint32_t> path = {0, 44};
  ExtPrivkey privkey0;
  EXPECT_NO_THROW((privkey0 = wallet.GeneratePrivkey(
      NetType::kMainnet, path, format_type)));
  EXPECT_STREQ(privkey0.ToString().c_str(), "zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED");

  KeyData keypath1;
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePrivkeyData(
      NetType::kMainnet, "m/0h/44h", format_type)));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43");

  ExtPubkey pubkey;
  EXPECT_NO_THROW((pubkey = wallet.GeneratePubkey(NetType::kMainnet, format_type)));
  EXPECT_STREQ(pubkey.ToString().c_str(), "zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c");

  EXPECT_NO_THROW((pubkey = wallet.GeneratePubkey(NetType::kTestnet, format_type)));
  EXPECT_STREQ(pubkey.ToString().c_str(), "vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8");

  ExtPubkey pubkey0;
  EXPECT_NO_THROW((pubkey0 = wallet.GeneratePubkey(NetType::kMainnet, path, format_type)));
  EXPECT_STREQ(pubkey0.ToString().c_str(), "zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj");

  ExtPubkey pubkeyh;
  EXPECT_NO_THROW((pubkeyh = wallet.GeneratePubkey(NetType::kMainnet, "m/0H/44H", format_type)));
  EXPECT_STREQ(pubkeyh.ToString().c_str(), "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");
  
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePubkeyData(NetType::kMainnet, "m/0H/44H", format_type)));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");

  std::vector<uint32_t> path2 = {0x80000000, 0x80000000 + 44};
  KeyData keypath2;
  EXPECT_NO_THROW((keypath2 = wallet.GeneratePubkeyData(NetType::kMainnet, path2, format_type)));
  EXPECT_STREQ(keypath2.ToString(false).c_str(), "[b4e3f5ed/0'/44']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");

  // parse key
  ExtPrivkey vpriv1(
    "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M");
  EXPECT_EQ(NetType::kTestnet, vpriv1.GetNetworkType());
  EXPECT_EQ(format_type, vpriv1.GetFormatType());
  ExtPubkey zpub1(
    "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");
  EXPECT_EQ(NetType::kMainnet, zpub1.GetNetworkType());
  EXPECT_EQ(format_type, zpub1.GetFormatType());

  // Get address list
  auto addr = vpriv1.GetPubkeyAddress();
  EXPECT_EQ("tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l",
    addr.GetAddress());
  auto addrs = zpub1.GetPubkeyAddresses();
  EXPECT_EQ(1, addrs.size());
  EXPECT_EQ("bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9",
    addrs[0].GetAddress());
}